

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

reference __thiscall
nonstd::span_lite::span<unsigned_char,_18446744073709551615UL>::operator[]
          (span<unsigned_char,_18446744073709551615UL> *this,size_type idx)

{
  bool bVar1;
  size_type sVar2;
  pointer puVar3;
  size_type idx_local;
  span<unsigned_char,_18446744073709551615UL> *this_local;
  
  bVar1 = detail::is_positive<unsigned_long>(idx);
  if ((!bVar1) || (sVar2 = size(this), sVar2 <= idx)) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1241: Precondition violation."
              );
  }
  puVar3 = data(this);
  return puVar3 + idx;
}

Assistant:

span_constexpr_exp reference operator[]( size_type idx ) const
    {
        span_EXPECTS( detail::is_positive( idx ) && idx < size() );

        return *( data() + idx );
    }